

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  int iVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  XmlOutput *pXVar6;
  char *pcVar7;
  undefined4 in_register_00000034;
  storage_type *psVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  xml_output local_2d8;
  xml_output local_2a0;
  xml_output local_268;
  xml_output local_230;
  xml_output local_1f8;
  xml_output local_1c0;
  xml_output local_188;
  xml_output local_150;
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar9.m_data = (storage_type *)0x3;
  QVar9.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar9);
  local_70.xo_text.d.size = (qsizetype)local_70.xo_text.d.ptr;
  pQVar4 = (QArrayData *)CONCAT44(local_70._4_4_,local_70.xo_type);
  local_70.xo_type = tTag;
  local_70.xo_text.d.ptr = (char16_t *)local_70.xo_text.d.d;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.xo_value.d.d = (Data *)0x0;
  local_70.xo_value.d.ptr = (char16_t *)0x0;
  local_70.xo_value.d.size = 0;
  local_70.xo_text.d.d = (Data *)pQVar4;
  pXVar6 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  attrTagX(&local_a8,"AdditionalDependencies",(QStringList *)((long)__buf + 8),";");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_a8);
  attrTagX(&local_e0,"AdditionalLibraryDirectories",(QStringList *)((long)__buf + 0x20),";");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_e0);
  attrTagX(&local_118,"AdditionalOptions",(QStringList *)((long)__buf + 0x38)," ");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_118);
  attrTagX(&local_150,"ExportNamedFunctions",(QStringList *)((long)__buf + 0x50),";");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_150);
  attrTagX(&local_188,"ForceSymbolReferences",(QStringList *)((long)__buf + 0x68),";");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_188);
  iVar2 = *(int *)((long)__buf + 0x80);
  if (iVar2 == -1) {
    local_1c0.xo_type = tNothing;
    local_1c0.xo_text.d.d = (Data *)0x0;
    local_1c0.xo_text.d.ptr = (char16_t *)0x0;
    local_1c0.xo_text.d.size = 0;
    local_1c0.xo_value.d.d = (Data *)0x0;
    local_1c0.xo_value.d.ptr = (char16_t *)0x0;
    local_1c0.xo_value.d.size = 0;
  }
  else {
    QVar10.m_data = (storage_type *)0x19;
    QVar10.m_size = (qsizetype)&local_1c0;
    QString::fromUtf8(QVar10);
    local_1c0.xo_text.d.size = (qsizetype)local_1c0.xo_text.d.ptr;
    pDVar5 = local_1c0.xo_text.d.d;
    pQVar3 = (QArrayData *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
    pcVar7 = "false";
    if (iVar2 == 1) {
      pcVar7 = "true";
    }
    psVar8 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar8 + (long)(pcVar7 + 1);
      psVar8 = psVar8 + 1;
    } while (*pcVar1 != '\0');
    QVar11.m_data = psVar8;
    QVar11.m_size = (qsizetype)&local_1c0;
    QString::fromUtf8(QVar11);
    local_1c0.xo_value.d.size = (qsizetype)local_1c0.xo_text.d.ptr;
    local_1c0.xo_value.d.d = (Data *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
    local_1c0.xo_type = tTagValue;
    local_1c0.xo_text.d.ptr = (char16_t *)pDVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1c0.xo_value.d.ptr = (char16_t *)local_1c0.xo_text.d.d;
    local_1c0.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_1c0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_1c0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_1c0);
  attrTagX(&local_1f8,"IgnoreSpecificDefaultLibraries",(QStringList *)((long)__buf + 0x88),";");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_1f8);
  if (*(long *)((long)__buf + 0xb0) == 0) {
    local_230.xo_type = tNothing;
    local_230.xo_text.d.d = (Data *)0x0;
    local_230.xo_text.d.ptr = (char16_t *)0x0;
    local_230.xo_text.d.size = 0;
    local_230.xo_value.d.d = (Data *)0x0;
    local_230.xo_value.d.ptr = (char16_t *)0x0;
    local_230.xo_value.d.size = 0;
  }
  else {
    QVar12.m_data = (storage_type *)0x14;
    QVar12.m_size = (qsizetype)&local_230;
    QString::fromUtf8(QVar12);
    local_230.xo_text.d.size = (qsizetype)local_230.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_230._4_4_,local_230.xo_type);
    local_230.xo_type = tTagValue;
    local_230.xo_text.d.ptr = (char16_t *)local_230.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_230.xo_value.d.d = *(Data **)((long)__buf + 0xa0);
    local_230.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xa8);
    local_230.xo_value.d.size = *(qsizetype *)((long)__buf + 0xb0);
    if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_230.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_230);
  if (*(long *)((long)__buf + 200) == 0) {
    local_268.xo_type = tNothing;
    local_268.xo_text.d.d = (Data *)0x0;
    local_268.xo_text.d.ptr = (char16_t *)0x0;
    local_268.xo_text.d.size = 0;
    local_268.xo_value.d.d = (Data *)0x0;
    local_268.xo_value.d.ptr = (char16_t *)0x0;
    local_268.xo_value.d.size = 0;
  }
  else {
    QVar13.m_data = (storage_type *)0xa;
    QVar13.m_size = (qsizetype)&local_268;
    QString::fromUtf8(QVar13);
    local_268.xo_text.d.size = (qsizetype)local_268.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_268._4_4_,local_268.xo_type);
    local_268.xo_type = tTagValue;
    local_268.xo_text.d.ptr = (char16_t *)local_268.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_268.xo_value.d.d = *(Data **)((long)__buf + 0xb8);
    local_268.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xc0);
    local_268.xo_value.d.size = *(qsizetype *)((long)__buf + 200);
    if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_268.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_268);
  iVar2 = *(int *)((long)__buf + 0xd0);
  if (iVar2 == -1) {
    local_2a0.xo_type = tNothing;
    local_2a0.xo_text.d.d = (Data *)0x0;
    local_2a0.xo_text.d.ptr = (char16_t *)0x0;
    local_2a0.xo_text.d.size = 0;
    local_2a0.xo_value.d.d = (Data *)0x0;
    local_2a0.xo_value.d.ptr = (char16_t *)0x0;
    local_2a0.xo_value.d.size = 0;
  }
  else {
    QVar14.m_data = (storage_type *)0x15;
    QVar14.m_size = (qsizetype)&local_2a0;
    QString::fromUtf8(QVar14);
    local_2a0.xo_text.d.size = (qsizetype)local_2a0.xo_text.d.ptr;
    pDVar5 = local_2a0.xo_text.d.d;
    pQVar3 = (QArrayData *)CONCAT44(local_2a0._4_4_,local_2a0.xo_type);
    pcVar7 = "false";
    if (iVar2 == 1) {
      pcVar7 = "true";
    }
    psVar8 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar8 + (long)(pcVar7 + 1);
      psVar8 = psVar8 + 1;
    } while (*pcVar1 != '\0');
    QVar15.m_data = psVar8;
    QVar15.m_size = (qsizetype)&local_2a0;
    QString::fromUtf8(QVar15);
    local_2a0.xo_value.d.size = (qsizetype)local_2a0.xo_text.d.ptr;
    local_2a0.xo_value.d.d = (Data *)CONCAT44(local_2a0._4_4_,local_2a0.xo_type);
    local_2a0.xo_type = tTagValue;
    local_2a0.xo_text.d.ptr = (char16_t *)pDVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2a0.xo_value.d.ptr = (char16_t *)local_2a0.xo_text.d.d;
    local_2a0.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_2a0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_2a0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_2a0);
  QVar16.m_data = (storage_type *)0x3;
  QVar16.m_size = (qsizetype)&local_2d8;
  QString::fromUtf8(QVar16);
  local_2d8.xo_text.d.size = (qsizetype)local_2d8.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_2d8._4_4_,local_2d8.xo_type);
  local_2d8.xo_type = tCloseTag;
  local_2d8.xo_text.d.ptr = (char16_t *)local_2d8.xo_text.d.d;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2d8.xo_value.d.d = (Data *)0x0;
  local_2d8.xo_value.d.ptr = (char16_t *)0x0;
  local_2d8.xo_value.d.size = 0;
  local_2d8.xo_text.d.d = (Data *)pQVar3;
  XmlOutput::operator<<(pXVar6,&local_2d8);
  if (&(local_2d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_268.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_268.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_230.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_230.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_188.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_188.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_150.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_150.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCLibrarianTool &tool)
{
    xml
        << tag(_Lib)
            << attrTagX(_AdditionalDependencies, tool.AdditionalDependencies, ";")
            << attrTagX(_AdditionalLibraryDirectories, tool.AdditionalLibraryDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagX(_ExportNamedFunctions, tool.ExportNamedFunctions, ";")
            << attrTagX(_ForceSymbolReferences, tool.ForceSymbolReferences, ";")
            << attrTagT(_IgnoreAllDefaultLibraries, tool.IgnoreAllDefaultLibraries)
            << attrTagX(_IgnoreSpecificDefaultLibraries, tool.IgnoreDefaultLibraryNames, ";")
            << attrTagS(_ModuleDefinitionFile, tool.ModuleDefinitionFile)
            << attrTagS(_OutputFile, tool.OutputFile)
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << closetag(_Lib);
}